

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::CostAttributes::initializeBuffers
          (CostAttributes *this,uint rangeSize,uint totalDimension)

{
  element_type *peVar1;
  uint in_EDX;
  uint in_ESI;
  DenseBase<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_RDI;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffffea0;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffea8;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffeb0;
  MatrixBase<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffeb8;
  MatrixDynSize *in_stack_fffffffffffffec8;
  
  iDynTree::VectorDynSize::resize((ulong)(in_RDI + 0x108));
  iDynTree::VectorDynSize::zero();
  std::
  make_shared<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>,iDynTree::VectorDynSize&>
            ((VectorDynSize *)in_stack_fffffffffffffec8);
  std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>>::operator=
            ((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_> *)
             in_stack_fffffffffffffea0,
             (shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_> *)
             in_RDI);
  std::shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_>::
  ~shared_ptr((shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_> *
              )0x34ed68);
  iDynTree::MatrixDynSize::resize((ulong)(in_RDI + 0xd0),(ulong)in_ESI);
  toEigen(in_stack_fffffffffffffec8);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
  ::setIdentity((MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)0x34edaf);
  iDynTree::MatrixDynSize::resize((ulong)(in_RDI + 0x80),(ulong)in_EDX);
  peVar1 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x34ede1);
  (*peVar1->_vptr_Selector[3])();
  toEigen(in_stack_fffffffffffffec8);
  Eigen::
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
  transpose(in_stack_fffffffffffffea8);
  toEigen(in_stack_fffffffffffffec8);
  Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>::operator=
            (in_stack_fffffffffffffea0,in_RDI);
  iDynTree::MatrixDynSize::resize((ulong)(in_RDI + 0xa8),(ulong)in_EDX);
  peVar1 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x34ee6e);
  (*peVar1->_vptr_Selector[3])();
  toEigen(in_stack_fffffffffffffec8);
  Eigen::
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
  transpose(in_stack_fffffffffffffea8);
  peVar1 = std::
           __shared_ptr_access<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Selector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x34eea3);
  (*peVar1->_vptr_Selector[3])();
  toEigen(in_stack_fffffffffffffec8);
  Eigen::
  MatrixBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::Stride<0,0>>>>
  ::operator*(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  toEigen(in_stack_fffffffffffffec8);
  Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>::operator=
            (in_stack_fffffffffffffea0,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
              *)in_RDI);
  *in_RDI = (DenseBase<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
             )0x1;
  return;
}

Assistant:

void initializeBuffers(unsigned int rangeSize, unsigned int totalDimension) {
                this->buffer.resize(rangeSize);
                this->buffer.zero();
                this->desiredTrajectory = std::make_shared<TimeInvariantVector>(this->buffer);
                this->weightMatrix.resize(rangeSize, rangeSize);
                toEigen(this->weightMatrix).setIdentity();
                this->gradientSubMatrix.resize(totalDimension, rangeSize);
                toEigen(this->gradientSubMatrix) = toEigen(this->selector->asSelectorMatrix()).transpose();
                this->hessianMatrix.resize(totalDimension, totalDimension);
                toEigen(this->hessianMatrix) = toEigen(this->selector->asSelectorMatrix()).transpose() * toEigen(this->selector->asSelectorMatrix());
                this->m_valid = true;
            }